

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O1

char16 * __thiscall Js::CompoundString::GetSz(CompoundString *this)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cch;
  charcount_t cVar3;
  BOOL BVar4;
  char16 *pcVar5;
  undefined4 *puVar6;
  JavascriptString *this_00;
  Recycler *pRVar7;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  pcVar5 = JavascriptString::UnsafeGetBuffer((JavascriptString *)this);
  if (pcVar5 != (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,999,"(!IsFinalized())","!IsFinalized()");
    if (!bVar2) goto LAB_00b38fca;
    *puVar6 = 0;
  }
  cch = JavascriptString::GetLength((JavascriptString *)this);
  if (cch == 1) {
    if (this->directCharLength != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                  ,0x3f7,"(HasOnlyDirectChars())","HasOnlyDirectChars()");
      if (!bVar2) goto LAB_00b38fca;
      *puVar6 = 0;
    }
    if ((this->lastBlockInfo).charLength != 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                  ,0x3f8,"(LastBlockCharLength() == 1)","LastBlockCharLength() == 1"
                                 );
      if (!bVar2) {
LAB_00b38fca:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    this_00 = CharStringCache::GetStringForChar
                        (&((((this->super_LiteralString).super_JavascriptString.
                             super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                          charStringCache,*(this->lastBlockInfo).buffer.ptr);
    pcVar5 = JavascriptString::UnsafeGetBuffer(this_00);
  }
  else {
    if (cch == 0) {
      (this->lastBlock).ptr = (Block *)0x0;
      (this->lastBlockInfo).buffer.ptr = (void *)0x0;
      (this->lastBlockInfo).charLength = 0;
      (this->lastBlockInfo).charCapacity = 0;
      *(undefined8 *)((long)&(this->lastBlockInfo).charCapacity + 1) = 0;
      pcVar5 = L"";
      goto LAB_00b38f96;
    }
    if (((this->ownsLastBlock == true) && (this->directCharLength == 0xffffffff)) &&
       ((this->lastBlock).ptr == (Block *)0x0)) {
      bVar2 = TryAppendGeneric<Js::CompoundString>(L'\0',this);
      if (bVar2) {
        JavascriptString::SetLength((JavascriptString *)this,cch);
        pcVar5 = (char16 *)(this->lastBlockInfo).buffer.ptr;
        (this->lastBlock).ptr = (Block *)0x0;
        *(undefined8 *)((long)&(this->lastBlockInfo).charCapacity + 1) = 0;
        (this->lastBlockInfo).buffer.ptr = (void *)0x0;
        (this->lastBlockInfo).charLength = 0;
        (this->lastBlockInfo).charCapacity = 0;
        goto LAB_00b38f96;
      }
    }
    pRVar7 = ((((((this->super_LiteralString).super_JavascriptString.super_RecyclableObject.type.ptr
                 )->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
             recycler;
    cVar3 = JavascriptString::SafeSzSize(cch);
    data.plusSize = (size_t)cVar3;
    local_58 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_6104351;
    data.filename._0_4_ = 0x40f;
    pRVar7 = Memory::Recycler::TrackAllocInfo(pRVar7,(TrackAllocData *)local_58);
    cVar3 = JavascriptString::SafeSzSize(cch);
    if (cVar3 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(pRVar7,(TrackAllocData *)0x0);
      pcVar5 = (char16 *)&DAT_00000008;
    }
    else {
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_00b38fca;
        *puVar6 = 0;
      }
      pcVar5 = (char16 *)
               Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                         (pRVar7,(ulong)cVar3 * 2);
      if (pcVar5 == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar2) goto LAB_00b38fca;
        *puVar6 = 0;
      }
    }
    pcVar5[cch] = L'\0';
    JavascriptString::Copy<Js::CompoundString>((JavascriptString *)this,pcVar5,cch);
    if (pcVar5[cch] != L'\0') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                  ,0x412,"(buffer[totalCharLength] == u\'\\0\')",
                                  "buffer[totalCharLength] == _u(\'\\0\')");
      if (!bVar2) goto LAB_00b38fca;
      *puVar6 = 0;
    }
  }
  (this->lastBlock).ptr = (Block *)0x0;
  (this->lastBlockInfo).buffer.ptr = (void *)0x0;
  (this->lastBlockInfo).charLength = 0;
  (this->lastBlockInfo).charCapacity = 0;
  *(undefined8 *)((long)&(this->lastBlockInfo).charCapacity + 1) = 0;
LAB_00b38f96:
  JavascriptString::SetBuffer((JavascriptString *)this,pcVar5);
  (this->super_LiteralString).super_JavascriptString.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)VirtualTableInfo<Js::LiteralStringWithPropertyStringPtr>::Address;
  LiteralStringWithPropertyStringPtr::SetPropertyString
            ((LiteralStringWithPropertyStringPtr *)this,(PropertyString *)0x0);
  return pcVar5;
}

Assistant:

const char16 *CompoundString::GetSz()
    {
        Assert(!IsFinalized());

        const CharCount totalCharLength = GetLength();
        switch(totalCharLength)
        {
            case 0:
            {
                Unreference();
                const char16 *const buffer = _u("");
                SetBuffer(buffer);
                LiteralStringWithPropertyStringPtr::ConvertString(this);
                return buffer;
            }

            case 1:
            {
                Assert(HasOnlyDirectChars());
                Assert(LastBlockCharLength() == 1);

                const char16 *const buffer = GetLibrary()->GetCharStringCache().GetStringForChar(LastBlockChars()[0])->UnsafeGetBuffer();
                Unreference();
                SetBuffer(buffer);
                LiteralStringWithPropertyStringPtr::ConvertString(this);
                return buffer;
            }
        }

        if(OwnsLastBlock() && HasOnlyDirectChars() && !lastBlock && TryAppendGeneric(_u('\0'), this)) // GetSz() requires null termination
        {
            // There is no last block. Only the buffer was allocated, and is held in 'lastBlockInfo'. Since this string owns the
            // last block, has only direct chars, and the buffer was allocated directly (buffer pointer is not an internal
            // pointer), there is no need to copy the buffer.
            SetLength(totalCharLength); // terminating null should not count towards the string length
            const char16 *const buffer = LastBlockChars();
            Unreference();
            SetBuffer(buffer);
            LiteralStringWithPropertyStringPtr::ConvertString(this);
            return buffer;
        }

        char16 *const buffer = RecyclerNewArrayLeaf(GetScriptContext()->GetRecycler(), char16, SafeSzSize(totalCharLength));
        buffer[totalCharLength] = _u('\0'); // GetSz() requires null termination
        Copy<CompoundString>(buffer, totalCharLength);
        Assert(buffer[totalCharLength] == _u('\0'));
        Unreference();
        SetBuffer(buffer);
        LiteralStringWithPropertyStringPtr::ConvertString(this);
        return buffer;
    }